

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O1

void __thiscall Js::ScriptContext::ProfilePrint(ScriptContext *this)

{
  ScriptContextProfiler *this_00;
  code *pcVar1;
  bool bVar2;
  Phase phase;
  undefined4 *puVar3;
  
  if (this->disableProfiler != false) {
    return;
  }
  if (this->profiler == (ScriptContextProfiler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0xcd5,"(profiler != nullptr)","profiler != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  Memory::Recycler::EnsureNotCollecting(this->recycler);
  this_00 = this->profiler;
  phase = Phases::GetFirstPhase((Phases *)&DAT_015c4a90);
  ScriptContextProfiler::ProfilePrint(this_00,phase);
  ProfilePrintNativeCodeGen(this->nativeCodeGen);
  return;
}

Assistant:

void
        ScriptContext::ProfilePrint()
    {
            if (disableProfiler)
            {
                return;
            }

            Assert(profiler != nullptr);
            recycler->EnsureNotCollecting();
            profiler->ProfilePrint(Js::Configuration::Global.flags.Profile.GetFirstPhase());
#if ENABLE_NATIVE_CODEGEN
            ProfilePrintNativeCodeGen(this->nativeCodeGen);
#endif
    }